

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

int __thiscall MeCab::Writer::open(Writer *this,char *__file,int __oflag,...)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string eon_format2;
  string unk_format2;
  string eos_format2;
  string bos_format2;
  string node_format2;
  string tmp;
  string eon_format_key;
  string unk_format_key;
  string eos_format_key;
  string bos_format_key;
  string node_format_key;
  string eon_format;
  string eos_format;
  string bos_format;
  string unk_format;
  string node_format;
  string ostyle;
  whatlog *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  scoped_string *str;
  scoped_string *in_stack_fffffffffffffc50;
  scoped_string *this_00;
  char *in_stack_fffffffffffffd00;
  allocator *key;
  Param *in_stack_fffffffffffffd08;
  Param *this_01;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [36];
  uint local_204;
  wlog local_200;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  undefined1 local_131 [40];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [48];
  string local_38 [32];
  char *local_18;
  Writer *local_10;
  undefined1 local_1;
  
  local_18 = __file;
  local_10 = this;
  Param::get<std::__cxx11::string>(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  this->write_ = (offset_in_Writer_to_subr)writeLattice;
  *(undefined8 *)&this->field_0x1f8 = 0;
  bVar1 = std::operator==(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
  if (bVar1) {
    this->write_ = (offset_in_Writer_to_subr)writeWakati;
    *(undefined8 *)&this->field_0x1f8 = 0;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    if (bVar1) {
      this->write_ = (offset_in_Writer_to_subr)writeNone;
      *(undefined8 *)&this->field_0x1f8 = 0;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
      if (bVar1) {
        this->write_ = (offset_in_Writer_to_subr)writeDump;
        *(undefined8 *)&this->field_0x1f8 = 0;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
        if (bVar1) {
          this->write_ = (offset_in_Writer_to_subr)writeEM;
          *(undefined8 *)&this->field_0x1f8 = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_68,"%m\\t%H\\n",&local_69);
          std::allocator<char>::~allocator((allocator<char> *)&local_69);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_90,"%m\\t%H\\n",&local_91);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b8,"",&local_b9);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,"EOS\\n",&local_e1);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,"",&local_109);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
          this_01 = (Param *)local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)(local_131 + 1),"node-format",(allocator *)this_01)
          ;
          std::allocator<char>::~allocator((allocator<char> *)local_131);
          key = &local_159;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_158,"bos-format",key);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_180,"eos-format",&local_181);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8,"unk-format",&local_1a9);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d0,"eon-format",&local_1d1);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            std::__cxx11::string::operator+=((string *)(local_131 + 1),"-");
            std::__cxx11::string::operator+=((string *)(local_131 + 1),local_38);
            std::__cxx11::string::operator+=(local_158,"-");
            std::__cxx11::string::operator+=(local_158,local_38);
            std::__cxx11::string::operator+=(local_180,"-");
            std::__cxx11::string::operator+=(local_180,local_38);
            std::__cxx11::string::operator+=(local_1a8,"-");
            std::__cxx11::string::operator+=(local_1a8,local_38);
            std::__cxx11::string::operator+=(local_1d0,"-");
            std::__cxx11::string::operator+=(local_1d0,local_38);
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            uVar2 = std::__cxx11::string::empty();
            bVar1 = (uVar2 & 1) != 0;
            if (bVar1) {
              wlog::wlog((wlog *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
              poVar3 = std::operator<<((ostream *)&this->what_,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/writer.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,"(");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
              poVar3 = std::operator<<(poVar3,") [");
              poVar3 = std::operator<<(poVar3,"!tmp.empty()");
              poVar3 = std::operator<<(poVar3,"] ");
              poVar3 = std::operator<<(poVar3,"unkown format type [");
              poVar3 = std::operator<<(poVar3,local_38);
              poVar3 = std::operator<<(poVar3,"]");
              local_1 = wlog::operator&(&local_200,poVar3);
            }
            local_204 = (uint)bVar1;
            std::__cxx11::string::~string(local_1f8);
            if (local_204 == 0) goto LAB_0016242b;
          }
          else {
LAB_0016242b:
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            std::__cxx11::string::c_str();
            Param::get<std::__cxx11::string>(this_01,(char *)key);
            bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffc38);
            if ((((bVar1) ||
                 (bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffffc38), bVar1)) ||
                (bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffffc38), bVar1)) ||
               (bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffc38), bVar1)) {
              this->write_ = (offset_in_Writer_to_subr)writeUser;
              *(undefined8 *)&this->field_0x1f8 = 0;
              bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc38);
              if (bVar1) {
                std::__cxx11::string::operator=(local_68,local_228);
              }
              bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc38);
              if (bVar1) {
                std::__cxx11::string::operator=(local_b8,local_248);
              }
              bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc38);
              if (bVar1) {
                std::__cxx11::string::operator=(local_e0,local_268);
              }
              bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc38);
              if (bVar1) {
                std::__cxx11::string::operator=(local_90,local_288);
              }
              else {
                bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffc38);
                if (bVar1) {
                  std::__cxx11::string::operator=(local_90,local_228);
                }
                else {
                  std::__cxx11::string::operator=(local_90,local_68);
                }
              }
              bVar1 = std::operator!=(in_stack_fffffffffffffc40,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffc38);
              if (bVar1) {
                std::__cxx11::string::operator=(local_108,local_2a8);
              }
              std::__cxx11::string::c_str();
              scoped_string::reset_string(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              std::__cxx11::string::c_str();
              scoped_string::reset_string(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              this_00 = &this->eos_format_;
              std::__cxx11::string::c_str();
              scoped_string::reset_string(this_00,in_stack_fffffffffffffc48);
              str = &this->unk_format_;
              std::__cxx11::string::c_str();
              scoped_string::reset_string(this_00,(char *)str);
              std::__cxx11::string::c_str();
              scoped_string::reset_string(this_00,(char *)str);
            }
            std::__cxx11::string::~string(local_2a8);
            std::__cxx11::string::~string(local_288);
            std::__cxx11::string::~string(local_268);
            std::__cxx11::string::~string(local_248);
            std::__cxx11::string::~string(local_228);
            local_204 = 0;
          }
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::string::~string(local_1a8);
          std::__cxx11::string::~string(local_180);
          std::__cxx11::string::~string(local_158);
          std::__cxx11::string::~string((string *)(local_131 + 1));
          std::__cxx11::string::~string(local_108);
          std::__cxx11::string::~string(local_e0);
          std::__cxx11::string::~string(local_b8);
          std::__cxx11::string::~string(local_90);
          std::__cxx11::string::~string(local_68);
          if (local_204 != 0) goto LAB_00162a25;
        }
      }
    }
  }
  local_1 = 1;
  local_204 = 1;
LAB_00162a25:
  uVar4 = std::__cxx11::string::~string(local_38);
  return (uint)CONCAT71((int7)((ulong)uVar4 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool Writer::open(const Param &param) {
  const std::string ostyle = param.get<std::string>("output-format-type");
  write_ = &Writer::writeLattice;

  if (ostyle == "wakati") {
    write_ = &Writer::writeWakati;
  } else if (ostyle == "none") {
    write_ = &Writer::writeNone;
  } else if (ostyle == "dump") {
    write_ = &Writer::writeDump;
  } else if (ostyle == "em") {
    write_ = &Writer::writeEM;
  } else {
    // default values
    std::string node_format = "%m\\t%H\\n";
    std::string unk_format  = "%m\\t%H\\n";
    std::string bos_format  = "";
    std::string eos_format  = "EOS\\n";
    std::string eon_format  = "";

    std::string node_format_key = "node-format";
    std::string bos_format_key  = "bos-format";
    std::string eos_format_key  = "eos-format";
    std::string unk_format_key  = "unk-format";
    std::string eon_format_key  = "eon-format";

    if (!ostyle.empty()) {
      node_format_key += "-";
      node_format_key += ostyle;
      bos_format_key += "-";
      bos_format_key += ostyle;
      eos_format_key += "-";
      eos_format_key += ostyle;
      unk_format_key += "-";
      unk_format_key += ostyle;
      eon_format_key += "-";
      eon_format_key += ostyle;
      const std::string tmp = param.get<std::string>(node_format_key.c_str());
      CHECK_FALSE(!tmp.empty()) << "unkown format type [" << ostyle << "]";
    }

    const std::string node_format2 =
        param.get<std::string>(node_format_key.c_str());
    const std::string bos_format2 =
        param.get<std::string>(bos_format_key.c_str());
    const std::string eos_format2 =
        param.get<std::string>(eos_format_key.c_str());
    const std::string unk_format2 =
        param.get<std::string>(unk_format_key.c_str());
    const std::string eon_format2 =
        param.get<std::string>(eon_format_key.c_str());

    if (node_format != node_format2 || bos_format != bos_format2 ||
        eos_format != eos_format2 || unk_format != unk_format2) {
      write_ = &Writer::writeUser;
      if (node_format != node_format2) {
        node_format = node_format2;
      }
      if (bos_format != bos_format2) {
        bos_format = bos_format2;
      }
      if (eos_format != eos_format2) {
        eos_format = eos_format2;
      }
      if (unk_format != unk_format2) {
        unk_format = unk_format2;
      } else if (node_format != node_format2) {
        unk_format = node_format2;
      } else {
        unk_format = node_format;
      }
      if (eon_format != eon_format2) {
        eon_format = eon_format2;
      }
      node_format_.reset_string(node_format.c_str());
      bos_format_.reset_string(bos_format.c_str());
      eos_format_.reset_string(eos_format.c_str());
      unk_format_.reset_string(unk_format.c_str());
      eon_format_.reset_string(eon_format.c_str());
    }
  }

  return true;
}